

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.cpp
# Opt level: O0

void Diligent::ValidateTopLevelASDesc(TopLevelASDesc *Desc)

{
  RAYTRACING_BUILD_AS_FLAGS RVar1;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  TopLevelASDesc *local_10;
  TopLevelASDesc *Desc_local;
  
  local_10 = Desc;
  if (Desc->CompactedSize == 0) {
    if (Desc->MaxInstanceCount == 0) {
      if ((Desc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_48 = "";
      }
      else {
        local_48 = (Desc->super_DeviceObjectAttribs).Name;
      }
      local_28 = local_48;
      LogError<true,char[32],char_const*,char[15],char[35]>
                (false,"ValidateTopLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TopLevelASBase.cpp"
                 ,0x35,(char (*) [32])"Description of a top-level AS \'",&local_28,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [35])"MaxInstanceCount must not be zero.");
    }
    RVar1 = operator&(local_10->Flags,RAYTRACING_BUILD_AS_PREFER_FAST_TRACE);
    if ((RVar1 != RAYTRACING_BUILD_AS_NONE) &&
       (RVar1 = operator&(local_10->Flags,RAYTRACING_BUILD_AS_PREFER_FAST_BUILD),
       RVar1 != RAYTRACING_BUILD_AS_NONE)) {
      if ((local_10->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_50 = "";
      }
      else {
        local_50 = (local_10->super_DeviceObjectAttribs).Name;
      }
      local_30 = local_50;
      LogError<true,char[32],char_const*,char[15],char[110]>
                (false,"ValidateTopLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TopLevelASBase.cpp"
                 ,0x3a,(char (*) [32])"Description of a top-level AS \'",&local_30,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [110])
                 "RAYTRACING_BUILD_AS_PREFER_FAST_TRACE and RAYTRACING_BUILD_AS_PREFER_FAST_BUILD flags are mutually exclusive."
                );
    }
  }
  else {
    if (Desc->MaxInstanceCount != 0) {
      if ((Desc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_38 = "";
      }
      else {
        local_38 = (Desc->super_DeviceObjectAttribs).Name;
      }
      local_18 = local_38;
      LogError<true,char[32],char_const*,char[15],char[71]>
                (false,"ValidateTopLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TopLevelASBase.cpp"
                 ,0x29,(char (*) [32])"Description of a top-level AS \'",&local_18,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [71])
                 "If non-zero CompactedSize is specified, MaxInstanceCount must be zero.");
    }
    if (local_10->Flags != RAYTRACING_BUILD_AS_NONE) {
      if ((local_10->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_40 = "";
      }
      else {
        local_40 = (local_10->super_DeviceObjectAttribs).Name;
      }
      local_20 = local_40;
      LogError<true,char[32],char_const*,char[15],char[80]>
                (false,"ValidateTopLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TopLevelASBase.cpp"
                 ,0x2e,(char (*) [32])"Description of a top-level AS \'",&local_20,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [80])
                 "If non-zero CompactedSize is specified, Flags must be RAYTRACING_BUILD_AS_NONE.");
    }
  }
  return;
}

Assistant:

void ValidateTopLevelASDesc(const TopLevelASDesc& Desc) noexcept(false)
{
#define LOG_TLAS_ERROR_AND_THROW(...) LOG_ERROR_AND_THROW("Description of a top-level AS '", (Desc.Name ? Desc.Name : ""), "' is invalid: ", ##__VA_ARGS__)

    if (Desc.CompactedSize > 0)
    {
        if (Desc.MaxInstanceCount != 0)
        {
            LOG_TLAS_ERROR_AND_THROW("If non-zero CompactedSize is specified, MaxInstanceCount must be zero.");
        }

        if (Desc.Flags != RAYTRACING_BUILD_AS_NONE)
        {
            LOG_TLAS_ERROR_AND_THROW("If non-zero CompactedSize is specified, Flags must be RAYTRACING_BUILD_AS_NONE.");
        }
    }
    else
    {
        if (Desc.MaxInstanceCount == 0)
        {
            LOG_TLAS_ERROR_AND_THROW("MaxInstanceCount must not be zero.");
        }

        if ((Desc.Flags & RAYTRACING_BUILD_AS_PREFER_FAST_TRACE) != 0 && (Desc.Flags & RAYTRACING_BUILD_AS_PREFER_FAST_BUILD) != 0)
        {
            LOG_TLAS_ERROR_AND_THROW("RAYTRACING_BUILD_AS_PREFER_FAST_TRACE and RAYTRACING_BUILD_AS_PREFER_FAST_BUILD flags are mutually exclusive.");
        }
    }

#undef LOG_TLAS_ERROR_AND_THROW
}